

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfFunction.h
# Opt level: O3

void __thiscall
halfFunction<Imath_3_2::half>::halfFunction<Imf_3_4::roundNBit>
          (halfFunction<Imath_3_2::half> *this,roundNBit f,half domainMin,half domainMax,
          half defaultValue,half posInfValue,half negInfValue,half nanValue)

{
  float *pfVar1;
  float fVar2;
  long lVar3;
  half *phVar4;
  byte bVar5;
  half hVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar10;
  ushort uVar9;
  
  phVar4 = (half *)operator_new__(0x20000);
  this->_lut = phVar4;
  lVar3 = _imath_half_to_float_table;
  uVar7 = 0;
  do {
    uVar10 = (uint)uVar7;
    if ((uVar7 & 0x3ff) == 0 || (~uVar10 & 0x7c00) != 0) {
      uVar8 = (ushort)uVar7;
      if ((uVar10 & 0x7fff) == 0x7c00) {
        hVar6._h = posInfValue._h;
        if ((short)uVar8 < 0) {
          hVar6._h = negInfValue._h;
        }
      }
      else {
        fVar2 = *(float *)(lVar3 + uVar7 * 4);
        hVar6._h = defaultValue._h;
        if ((*(float *)(lVar3 + (ulong)domainMin._h * 4) <= fVar2) &&
           (pfVar1 = (float *)(lVar3 + (ulong)domainMax._h * 4), fVar2 < *pfVar1 || fVar2 == *pfVar1
           )) {
          if ((uint)f.n < 10) {
            bVar5 = (byte)(9U - f.n);
            uVar10 = ((uVar10 & 0x7fff) >> (bVar5 & 0x1f)) +
                     (uint)(((uVar10 & 0x7fff) >> (9U - f.n & 0x1f) & 1) != 0) << (bVar5 & 0x1f);
            uVar9 = (ushort)uVar10;
            if (0x7bff < (uVar10 & 0xfc00)) {
              uVar9 = (ushort)(-1 << (10U - (char)f.n & 0x1f)) & uVar8;
            }
            uVar8 = uVar9 | uVar8 & 0x8000;
          }
          phVar4[uVar7]._h = uVar8;
          goto LAB_00165cbd;
        }
      }
      phVar4[uVar7]._h = hVar6._h;
    }
    else {
      phVar4[uVar7]._h = nanValue._h;
    }
LAB_00165cbd:
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x10000) {
      return;
    }
  } while( true );
}

Assistant:

halfFunction<T>::halfFunction (
    Function f,
    half     domainMin,
    half     domainMax,
    T        defaultValue,
    T        posInfValue,
    T        negInfValue,
    T        nanValue)
{
#ifndef IMATH_HAVE_LARGE_STACK
    _lut = new T[1 << 16];
#endif

    for (int i = 0; i < (1 << 16); i++)
    {
        half x;
        x.setBits (i);

        if (x.isNan ())
            _lut[i] = nanValue;
        else if (x.isInfinity ())
            _lut[i] = x.isNegative () ? negInfValue : posInfValue;
        else if (x < domainMin || x > domainMax)
            _lut[i] = defaultValue;
        else
            _lut[i] = f (x);
    }
}